

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O2

void __thiscall cmGlobalNinjaGenerator::Generate(cmGlobalNinjaGenerator *this)

{
  char *lhss;
  cmake *this_00;
  Snapshot snapshot;
  bool bVar1;
  PolicyStatus PVar2;
  ostream *poVar3;
  Snapshot local_238;
  cmListFileBacktrace local_220;
  string local_1e0;
  cmCommandContext local_1c0;
  ostringstream msg;
  
  lhss = (this->NinjaVersion)._M_dataplus._M_p;
  RequiredNinjaVersion_abi_cxx11_();
  bVar1 = cmSystemTools::VersionCompare(OP_LESS,lhss,_msg);
  std::__cxx11::string::~string((string *)&msg);
  if (bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&msg);
    poVar3 = std::operator<<((ostream *)&msg,"The detected version of Ninja (");
    std::operator<<(poVar3,(string *)&this->NinjaVersion);
    std::operator<<((ostream *)&msg,") is less than the version of Ninja required by CMake (");
    RequiredNinjaVersion_abi_cxx11_();
    poVar3 = std::operator<<((ostream *)&msg,(string *)&local_220);
    std::operator<<(poVar3,").");
    std::__cxx11::string::~string((string *)&local_220);
    this_00 = (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.CMakeInstance;
    std::__cxx11::stringbuf::str();
    cmState::Snapshot::Snapshot(&local_238,(cmState *)0x0);
    local_1c0.Name._M_dataplus._M_p = (pointer)&local_1c0.Name.field_2;
    local_1c0.Name._M_string_length = 0;
    local_1c0.Name.field_2._M_local_buf[0] = '\0';
    local_1c0.Line = 0;
    snapshot.Position.Tree = local_238.Position.Tree;
    snapshot.State = local_238.State;
    snapshot.Position.Position = local_238.Position.Position;
    cmListFileBacktrace::cmListFileBacktrace(&local_220,snapshot,&local_1c0);
    cmake::IssueMessage(this_00,FATAL_ERROR,&local_1e0,&local_220,false);
    cmListFileBacktrace::~cmListFileBacktrace(&local_220);
    std::__cxx11::string::~string((string *)&local_1c0);
    std::__cxx11::string::~string((string *)&local_1e0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&msg);
  }
  else {
    OpenBuildFileStream(this);
    OpenRulesFileStream(this);
    PVar2 = cmMakefile::GetPolicyStatus
                      ((*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                         LocalGenerators.
                         super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>
                         ._M_impl.super__Vector_impl_data._M_start)->Makefile,CMP0058);
    this->PolicyCMP0058 = PVar2;
    this->ComputingUnknownDependencies = PVar2 < NEW;
    cmGlobalGenerator::Generate((cmGlobalGenerator *)this);
    WriteAssumedSourceDependencies(this);
    WriteTargetAliases(this,(ostream *)this->BuildFileStream);
    WriteUnknownExplicitDependencies(this,(ostream *)this->BuildFileStream);
    WriteBuiltinTargets(this,(ostream *)this->BuildFileStream);
    bVar1 = cmSystemTools::GetErrorOccuredFlag();
    if (bVar1) {
      std::ios::setstate((int)this->RulesFileStream +
                         (int)(this->RulesFileStream->super_ofstream).
                              super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
                              [-3]);
      std::ios::setstate((int)this->BuildFileStream +
                         (int)(this->BuildFileStream->super_ofstream).
                              super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
                              [-3]);
    }
    CloseCompileCommandsStream(this);
    CloseRulesFileStream(this);
    CloseBuildFileStream(this);
  }
  return;
}

Assistant:

void cmGlobalNinjaGenerator::Generate()
{
  // Check minimum Ninja version.
  if (cmSystemTools::VersionCompare(cmSystemTools::OP_LESS,
                                    this->NinjaVersion.c_str(),
                                    RequiredNinjaVersion().c_str()))
    {
    std::ostringstream msg;
    msg << "The detected version of Ninja (" << this->NinjaVersion;
    msg << ") is less than the version of Ninja required by CMake (";
    msg << this->RequiredNinjaVersion() << ").";
    this->GetCMakeInstance()->IssueMessage(cmake::FATAL_ERROR, msg.str());
    return;
    }
  this->OpenBuildFileStream();
  this->OpenRulesFileStream();

  this->PolicyCMP0058 =
    this->LocalGenerators[0]->GetMakefile()
    ->GetPolicyStatus(cmPolicies::CMP0058);
  this->ComputingUnknownDependencies =
    (this->PolicyCMP0058 == cmPolicies::OLD ||
     this->PolicyCMP0058 == cmPolicies::WARN);

  this->cmGlobalGenerator::Generate();

  this->WriteAssumedSourceDependencies();
  this->WriteTargetAliases(*this->BuildFileStream);
  this->WriteUnknownExplicitDependencies(*this->BuildFileStream);
  this->WriteBuiltinTargets(*this->BuildFileStream);

  if (cmSystemTools::GetErrorOccuredFlag()) {
    this->RulesFileStream->setstate(std::ios_base::failbit);
    this->BuildFileStream->setstate(std::ios_base::failbit);
  }

  this->CloseCompileCommandsStream();
  this->CloseRulesFileStream();
  this->CloseBuildFileStream();
}